

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlrole.c
# Opt level: O0

int element7(PROLOG_STATE *state,int tok,char *ptr,char *end,ENCODING *enc)

{
  ENCODING *enc_local;
  char *end_local;
  char *ptr_local;
  int tok_local;
  PROLOG_STATE *state_local;
  
  switch(tok) {
  case 0xf:
    state_local._4_4_ = 0;
    break;
  default:
    state_local._4_4_ = common(state,tok);
    break;
  case 0x15:
    state->handler = element6;
    state_local._4_4_ = 0x2c;
    break;
  case 0x18:
    state->level = state->level - 1;
    if (state->level == 0) {
      state->handler = declClose;
    }
    state_local._4_4_ = 0x28;
    break;
  case 0x23:
    state->level = state->level - 1;
    if (state->level == 0) {
      state->handler = declClose;
    }
    state_local._4_4_ = 0x2a;
    break;
  case 0x24:
    state->level = state->level - 1;
    if (state->level == 0) {
      state->handler = declClose;
    }
    state_local._4_4_ = 0x29;
    break;
  case 0x25:
    state->level = state->level - 1;
    if (state->level == 0) {
      state->handler = declClose;
    }
    state_local._4_4_ = 0x2b;
    break;
  case 0x26:
    state->handler = element6;
    state_local._4_4_ = 0x2d;
  }
  return state_local._4_4_;
}

Assistant:

static
int element7(PROLOG_STATE *state,
             int tok,
             const char *ptr,
             const char *end,
             const ENCODING *enc)
{
  cmExpatUnused(ptr);
  cmExpatUnused(end);
  cmExpatUnused(enc);
  switch (tok) {
  case XML_TOK_PROLOG_S:
    return XML_ROLE_NONE;
  case XML_TOK_CLOSE_PAREN:
    state->level -= 1;
    if (state->level == 0)
      state->handler = declClose;
    return XML_ROLE_GROUP_CLOSE;
  case XML_TOK_CLOSE_PAREN_ASTERISK:
    state->level -= 1;
    if (state->level == 0)
      state->handler = declClose;
    return XML_ROLE_GROUP_CLOSE_REP;
  case XML_TOK_CLOSE_PAREN_QUESTION:
    state->level -= 1;
    if (state->level == 0)
      state->handler = declClose;
    return XML_ROLE_GROUP_CLOSE_OPT;
  case XML_TOK_CLOSE_PAREN_PLUS:
    state->level -= 1;
    if (state->level == 0)
      state->handler = declClose;
    return XML_ROLE_GROUP_CLOSE_PLUS;
  case XML_TOK_COMMA:
    state->handler = element6;
    return XML_ROLE_GROUP_SEQUENCE;
  case XML_TOK_OR:
    state->handler = element6;
    return XML_ROLE_GROUP_CHOICE;
  }
  return common(state, tok);
}